

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

CURLsslset curl_global_sslset(curl_sslbackend id,char *name,curl_ssl_backend ***avail)

{
  int iVar1;
  CURLsslset CVar2;
  Curl_ssl *backend;
  Curl_ssl **ppCVar3;
  
  if (avail != (curl_ssl_backend ***)0x0) {
    *avail = (curl_ssl_backend **)available_backends;
  }
  if (Curl_ssl == &Curl_ssl_multi) {
    CVar2 = CURLSSLSET_UNKNOWN_BACKEND;
    if (available_backends[0] != (Curl_ssl *)0x0) {
      ppCVar3 = available_backends;
      backend = available_backends[0];
      do {
        ppCVar3 = ppCVar3 + 1;
        if ((backend->info).id == id) {
LAB_0014d7e9:
          multissl_init(backend);
          return CURLSSLSET_OK;
        }
        if ((name != (char *)0x0) &&
           (iVar1 = Curl_strcasecompare((backend->info).name,name), iVar1 != 0)) {
          backend = ppCVar3[-1];
          goto LAB_0014d7e9;
        }
        backend = *ppCVar3;
      } while (backend != (Curl_ssl *)0x0);
    }
  }
  else {
    CVar2 = CURLSSLSET_OK;
    if ((Curl_ssl->info).id != id) {
      if (name == (char *)0x0) {
        CVar2 = CURLSSLSET_UNKNOWN_BACKEND;
      }
      else {
        iVar1 = Curl_strcasecompare(name,(Curl_ssl->info).name);
        CVar2 = (CURLsslset)(iVar1 == 0);
      }
    }
  }
  return CVar2;
}

Assistant:

CURLsslset curl_global_sslset(curl_sslbackend id, const char *name,
                              const curl_ssl_backend ***avail)
{
  int i;

  if(avail)
    *avail = (const curl_ssl_backend **)&available_backends;

  if(Curl_ssl != &Curl_ssl_multi)
    return id == Curl_ssl->info.id ||
           (name && strcasecompare(name, Curl_ssl->info.name)) ?
           CURLSSLSET_OK :
#if defined(CURL_WITH_MULTI_SSL)
           CURLSSLSET_TOO_LATE;
#else
           CURLSSLSET_UNKNOWN_BACKEND;
#endif

  for(i = 0; available_backends[i]; i++) {
    if(available_backends[i]->info.id == id ||
       (name && strcasecompare(available_backends[i]->info.name, name))) {
      multissl_init(available_backends[i]);
      return CURLSSLSET_OK;
    }
  }

  return CURLSSLSET_UNKNOWN_BACKEND;
}